

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O0

void sgqf(int nt,double *aj,double *bj,double zemu,double *t,double *wts)

{
  double dVar1;
  int local_3c;
  int i;
  double *wts_local;
  double *t_local;
  double zemu_local;
  double *bj_local;
  double *aj_local;
  int nt_local;
  
  if (zemu <= 0.0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"SGQF - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  ZEMU <= 0.\n");
    exit(1);
  }
  for (local_3c = 0; local_3c < nt; local_3c = local_3c + 1) {
    t[local_3c] = aj[local_3c];
  }
  dVar1 = sqrt(zemu);
  *wts = dVar1;
  for (local_3c = 1; local_3c < nt; local_3c = local_3c + 1) {
    wts[local_3c] = 0.0;
  }
  imtqlx(nt,t,bj,wts);
  for (local_3c = 0; local_3c < nt; local_3c = local_3c + 1) {
    wts[local_3c] = wts[local_3c] * wts[local_3c];
  }
  return;
}

Assistant:

void sgqf ( int nt, double aj[], double bj[], double zemu, double t[], 
  double wts[] )

//****************************************************************************80
//
//  Purpose:
//
//    SGQF computes knots and weights of a Gauss Quadrature formula.
//
//  Discussion:
//
//    This routine computes all the knots and weights of a Gauss quadrature
//    formula with simple knots from the Jacobi matrix and the zero-th
//    moment of the weight function, using the Golub-Welsch technique.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    08 January 2010
//
//  Author:
//
//    Original FORTRAN77 version by Sylvan Elhay, Jaroslav Kautsky.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Sylvan Elhay, Jaroslav Kautsky,
//    Algorithm 655: IQPACK, FORTRAN Subroutines for the Weights of 
//    Interpolatory Quadrature,
//    ACM Transactions on Mathematical Software,
//    Volume 13, Number 4, December 1987, pages 399-415.
//
//  Parameters:
//
//    Input, int NT, the number of knots.
//
//    Input, double AJ[NT], the diagonal of the Jacobi matrix.
//
//    Input/output, double BJ[NT], the subdiagonal of the Jacobi 
//    matrix, in entries 1 through NT-1.  On output, BJ has been overwritten.
//
//    Input, double ZEMU, the zero-th moment of the weight function.
//
//    Output, double T[NT], the knots.
//
//    Output, double WTS[NT], the weights.
//
{
  int i;
//
//  Exit if the zero-th moment is not positive.
//
  if ( zemu <= 0.0 )
  {
    std::cerr << "\n";
    std::cerr << "SGQF - Fatal error!\n";
    std::cerr << "  ZEMU <= 0.\n";
    exit ( 1 );
  }
//
//  Set up vectors for IMTQLX.
//
  for ( i = 0; i < nt; i++ )
  {
    t[i] = aj[i];
  }
  wts[0] = sqrt ( zemu );
  for ( i = 1; i < nt; i++ )
  {
    wts[i] = 0.0;
  }
//
//  Diagonalize the Jacobi matrix.
//
  imtqlx ( nt, t, bj, wts );

  for ( i = 0; i < nt; i++ )
  {
    wts[i] = wts[i] * wts[i];
  }

  return;
}